

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsP2pkScript(Script *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ScriptOperator *this_00;
  bool local_45;
  ByteData local_30;
  Script *local_18;
  Script *this_local;
  
  local_18 = this;
  sVar3 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    (&this->script_stack_);
  bVar1 = false;
  local_45 = false;
  if (sVar3 == 2) {
    pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[](&this->script_stack_,0);
    bVar2 = ScriptElement::IsBinary(pvVar4);
    local_45 = false;
    if (bVar2) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,0);
      ScriptElement::GetBinaryData(&local_30,pvVar4);
      bVar1 = true;
      bVar2 = Pubkey::IsValid(&local_30);
      local_45 = false;
      if (bVar2) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        this_00 = ScriptElement::GetOpCode(pvVar4);
        local_45 = ScriptOperator::operator==(this_00,(ScriptOperator *)ScriptOperator::OP_CHECKSIG)
        ;
      }
    }
  }
  this_local._7_1_ = local_45;
  if (bVar1) {
    ByteData::~ByteData(&local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Script::IsP2pkScript() const {
  return (
      script_stack_.size() == 2 && script_stack_[0].IsBinary() &&
      Pubkey::IsValid(script_stack_[0].GetBinaryData()) &&
      script_stack_[1].GetOpCode() == ScriptOperator::OP_CHECKSIG);
}